

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

bool __thiscall
Imf_3_4::DeepTiledInputFile::isValidTile(DeepTiledInputFile *this,int dx,int dy,int lx,int ly)

{
  int32_t county;
  int32_t countx;
  
  exr_get_tile_counts(*(this->_ctxt)._ctxt.
                       super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      ((this->_data).
                       super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->partNumber,lx,ly);
  return false;
}

Assistant:

bool
DeepTiledInputFile::isValidTile (int dx, int dy, int lx, int ly) const
{
    int32_t countx = 0, county = 0;
    if (EXR_ERR_SUCCESS == exr_get_tile_counts (
            _ctxt, _data->partNumber, lx, ly, &countx, &county))
    {
        // get tile counts will check lx, ly for us
        return ((dx < countx && dx >= 0) &&
                (dy < county && dy >= 0));
    }
    return false;
}